

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O0

Gia_Man_t * Gia_ManDupOrderDfs(Gia_Man_t *p)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  Gia_Man_t *pNew_00;
  char *pcVar4;
  Gia_Obj_t *pGVar5;
  bool bVar6;
  int local_24;
  Gia_Obj_t *pGStack_20;
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t *pNew;
  Gia_Man_t *p_local;
  
  Gia_ManFillValue(p);
  iVar1 = Gia_ManObjNum(p);
  pNew_00 = Gia_ManStart(iVar1);
  pcVar4 = Abc_UtilStrsav(p->pName);
  pNew_00->pName = pcVar4;
  pcVar4 = Abc_UtilStrsav(p->pSpec);
  pNew_00->pSpec = pcVar4;
  pGVar5 = Gia_ManConst0(p);
  pGVar5->Value = 0;
  local_24 = 0;
  while( true ) {
    iVar1 = Vec_IntSize(p->vCos);
    bVar6 = false;
    if (local_24 < iVar1) {
      pGStack_20 = Gia_ManCo(p,local_24);
      bVar6 = pGStack_20 != (Gia_Obj_t *)0x0;
    }
    if (!bVar6) break;
    Gia_ManDupOrderDfs_rec(pNew_00,p,pGStack_20);
    local_24 = local_24 + 1;
  }
  local_24 = 0;
  while( true ) {
    iVar1 = Vec_IntSize(p->vCis);
    bVar6 = false;
    if (local_24 < iVar1) {
      pGStack_20 = Gia_ManCi(p,local_24);
      bVar6 = pGStack_20 != (Gia_Obj_t *)0x0;
    }
    if (!bVar6) break;
    if (pGStack_20->Value == 0xffffffff) {
      uVar2 = Gia_ManAppendCi(pNew_00);
      pGStack_20->Value = uVar2;
    }
    local_24 = local_24 + 1;
  }
  iVar1 = Gia_ManCiNum(pNew_00);
  iVar3 = Gia_ManCiNum(p);
  if (iVar1 == iVar3) {
    Gia_ManDupRemapCis(pNew_00,p);
    Gia_ManDupRemapEquiv(pNew_00,p);
    iVar1 = Gia_ManRegNum(p);
    Gia_ManSetRegNum(pNew_00,iVar1);
    return pNew_00;
  }
  __assert_fail("Gia_ManCiNum(pNew) == Gia_ManCiNum(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaDup.c"
                ,0xd9,"Gia_Man_t *Gia_ManDupOrderDfs(Gia_Man_t *)");
}

Assistant:

Gia_Man_t * Gia_ManDupOrderDfs( Gia_Man_t * p )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i;
    Gia_ManFillValue( p );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCo( p, pObj, i )
        Gia_ManDupOrderDfs_rec( pNew, p, pObj );
    Gia_ManForEachCi( p, pObj, i )
        if ( !~pObj->Value )
            pObj->Value = Gia_ManAppendCi(pNew);
    assert( Gia_ManCiNum(pNew) == Gia_ManCiNum(p) );
    Gia_ManDupRemapCis( pNew, p );
    Gia_ManDupRemapEquiv( pNew, p );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    return pNew;
}